

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uri.c
# Opt level: O0

int xmlParseUriOrPath(char *str,xmlURIPtr *out,int *drive)

{
  xmlChar *pxVar1;
  size_t sVar2;
  char *pcVar3;
  int prependSlash;
  size_t pathSize;
  char *path;
  xmlChar *pxStack_30;
  int ret;
  char *buf;
  xmlURIPtr uri;
  int *drive_local;
  xmlURIPtr *out_local;
  char *str_local;
  
  pxStack_30 = (xmlChar *)0x0;
  *out = (xmlURIPtr)0x0;
  *drive = 0;
  buf = (char *)xmlCreateURI();
  if ((xmlURIPtr)buf == (xmlURIPtr)0x0) {
    path._4_4_ = -1;
    goto LAB_00171a51;
  }
  pxVar1 = xmlStrstr((xmlChar *)str,"://");
  if (pxVar1 == (xmlChar *)0x0) {
    pxStack_30 = (xmlChar *)(*xmlMemStrdup)(str);
    if (pxStack_30 == (xmlChar *)0x0) {
      path._4_4_ = -1;
      goto LAB_00171a51;
    }
    xmlNormalizePath((char *)pxStack_30,1);
    xmlIsAbsolutePath(pxStack_30);
    sVar2 = strlen((char *)pxStack_30);
    pcVar3 = (char *)(*xmlMalloc)(sVar2 + 1);
    ((xmlURIPtr)buf)->path = pcVar3;
    if (((xmlURIPtr)buf)->path == (char *)0x0) {
      path._4_4_ = -1;
      goto LAB_00171a51;
    }
    memcpy(((xmlURIPtr)buf)->path,pxStack_30,sVar2 + 1);
  }
  else {
    path._4_4_ = xmlParseURIReference((xmlURIPtr)buf,str);
    if (path._4_4_ != 0) goto LAB_00171a51;
    xmlNormalizePath(((xmlURIPtr)buf)->path,0);
  }
  *out = (xmlURIPtr)buf;
  buf = (char *)0x0;
  path._4_4_ = 0;
LAB_00171a51:
  xmlFreeURI((xmlURIPtr)buf);
  (*xmlFree)(pxStack_30);
  return path._4_4_;
}

Assistant:

static int
xmlParseUriOrPath(const char *str, xmlURIPtr *out, int *drive) {
    xmlURIPtr uri;
    char *buf = NULL;
    int ret;

    *out = NULL;
    *drive = 0;

    uri = xmlCreateURI();
    if (uri == NULL) {
        ret = -1;
	goto done;
    }

    if (xmlStrstr(BAD_CAST str, BAD_CAST "://") == NULL) {
        const char *path;
        size_t pathSize;
        int prependSlash = 0;

        buf = xmlMemStrdup(str);
        if (buf == NULL) {
            ret = -1;
            goto done;
        }
        xmlNormalizePath(buf, /* isFile */ 1);

        path = buf;

        if (xmlIsAbsolutePath(BAD_CAST buf)) {
#if defined(_WIN32) || defined(__CYGWIN__)
            const char *server = NULL;
            int isFileScheme = 0;
#endif

#if defined(_WIN32) || defined(__CYGWIN__)
            if (strncmp(buf, "//?/UNC/", 8) == 0) {
                server = buf + 8;
                isFileScheme = 1;
            } else if (strncmp(buf, "//?/", 4) == 0) {
                path = buf + 3;
                isFileScheme = 1;
            } else if (strncmp(buf, "//", 2) == 0) {
                server = buf + 2;
                isFileScheme = 1;
            }

            if (server != NULL) {
                const char *end = strchr(server, '/');

                if (end == NULL) {
                    uri->server = xmlMemStrdup(server);
                    path = "/";
                } else {
                    uri->server = (char *) xmlStrndup(BAD_CAST server,
                                                      end - server);
                    path = end;
                }
                if (uri->server == NULL) {
                    ret = -1;
                    goto done;
                }
            }

            if ((((path[0] >= 'A') && (path[0] <= 'Z')) ||
                 ((path[0] >= 'a') && (path[0] <= 'z'))) &&
                (path[1] == ':')) {
                prependSlash = 1;
                isFileScheme = 1;
            }

            if (isFileScheme) {
                uri->scheme = xmlMemStrdup("file");
                if (uri->scheme == NULL) {
                    ret = -1;
                    goto done;
                }

                if (uri->server == NULL)
                    uri->port = PORT_EMPTY_SERVER;
            }
#endif
        }

        pathSize = strlen(path);
        uri->path = xmlMalloc(pathSize + prependSlash + 1);
        if (uri->path == NULL) {
            ret = -1;
            goto done;
        }
        if (prependSlash) {
            uri->path[0] = '/';
            memcpy(uri->path + 1, path, pathSize + 1);
        } else {
            memcpy(uri->path, path, pathSize + 1);
        }
    } else {
	ret = xmlParseURIReference(uri, str);
	if (ret != 0)
	    goto done;

        xmlNormalizePath(uri->path, /* isFile */ 0);
    }

#if defined(_WIN32) || defined(__CYGWIN__)
    if ((uri->path[0] == '/') &&
        (((uri->path[1] >= 'A') && (uri->path[1] <= 'Z')) ||
         ((uri->path[1] >= 'a') && (uri->path[1] <= 'z'))) &&
        (uri->path[2] == ':'))
        *drive = uri->path[1];
#endif

    *out = uri;
    uri = NULL;
    ret = 0;

done:
    xmlFreeURI(uri);
    xmlFree(buf);

    return(ret);
}